

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_broadcast(compiler_state_t *cstate,int proto)

{
  int iVar1;
  uint mask;
  block *pbVar2;
  block *pbVar3;
  block *b1_00;
  block *b2;
  block *b1;
  block *b0;
  bpf_u_int32 hostmask;
  int proto_local;
  compiler_state_t *cstate_local;
  
  if (1 < (uint)proto) {
    if (proto == 2) {
      if (cstate->netmask == 0xffffffff) {
        bpf_error(cstate,"netmask not known, so \'ip broadcast\' not supported");
      }
      pbVar2 = gen_linktype(cstate,0x800);
      mask = cstate->netmask ^ 0xffffffff;
      pbVar3 = gen_mcmp(cstate,OR_LINKPL,0x10,0,0,mask);
      b1_00 = gen_mcmp(cstate,OR_LINKPL,0x10,0,mask,mask);
      gen_or(pbVar3,b1_00);
      gen_and(pbVar2,b1_00);
      return b1_00;
    }
LAB_00112a87:
    bpf_error(cstate,"only link-layer/IP broadcast filters supported");
    return (block *)0x0;
  }
  iVar1 = cstate->linktype;
  if (iVar1 == 1) {
LAB_00112903:
    pbVar2 = gen_prevlinkhdr_check(cstate);
    pbVar3 = gen_ehostop(cstate,gen_broadcast::ebroadcast,2);
    if (pbVar2 == (block *)0x0) {
      return pbVar3;
    }
    gen_and(pbVar2,pbVar3);
    return pbVar3;
  }
  if (iVar1 == 6) {
    pbVar2 = gen_thostop(cstate,gen_broadcast::ebroadcast,2);
    return pbVar2;
  }
  if (iVar1 == 7) {
LAB_001128e5:
    cstate_local = (compiler_state_t *)gen_ahostop(cstate,"",2);
  }
  else {
    if (iVar1 == 10) {
      pbVar2 = gen_fhostop(cstate,gen_broadcast::ebroadcast,2);
      return pbVar2;
    }
    if ((iVar1 != 0x69) && (iVar1 != 0x77)) {
      if (iVar1 == 0x7a) {
        pbVar2 = gen_ipfchostop(cstate,gen_broadcast::ebroadcast,2);
        return pbVar2;
      }
      if (iVar1 != 0x7f) {
        if (iVar1 == 0x81) goto LAB_001128e5;
        if ((iVar1 != 0xa3) && (iVar1 != 0xc0)) {
          if (1 < iVar1 - 0xf0U) {
            bpf_error(cstate,"not a broadcast link");
            goto LAB_00112a87;
          }
          goto LAB_00112903;
        }
      }
    }
    cstate_local = (compiler_state_t *)gen_wlanhostop(cstate,gen_broadcast::ebroadcast,2);
  }
  return (block *)cstate_local;
}

Assistant:

struct block *
gen_broadcast(compiler_state_t *cstate, int proto)
{
	bpf_u_int32 hostmask;
	struct block *b0, *b1, *b2;
	static const u_char ebroadcast[] = { 0xff, 0xff, 0xff, 0xff, 0xff, 0xff };

	switch (proto) {

	case Q_DEFAULT:
	case Q_LINK:
		switch (cstate->linktype) {
		case DLT_ARCNET:
		case DLT_ARCNET_LINUX:
			return gen_ahostop(cstate, abroadcast, Q_DST);
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			b1 = gen_prevlinkhdr_check(cstate);
			b0 = gen_ehostop(cstate, ebroadcast, Q_DST);
			if (b1 != NULL)
				gen_and(b1, b0);
			return b0;
		case DLT_FDDI:
			return gen_fhostop(cstate, ebroadcast, Q_DST);
		case DLT_IEEE802:
			return gen_thostop(cstate, ebroadcast, Q_DST);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			return gen_wlanhostop(cstate, ebroadcast, Q_DST);
		case DLT_IP_OVER_FC:
			return gen_ipfchostop(cstate, ebroadcast, Q_DST);
		default:
			bpf_error(cstate, "not a broadcast link");
		}
		break;

	case Q_IP:
		/*
		 * We treat a netmask of PCAP_NETMASK_UNKNOWN (0xffffffff)
		 * as an indication that we don't know the netmask, and fail
		 * in that case.
		 */
		if (cstate->netmask == PCAP_NETMASK_UNKNOWN)
			bpf_error(cstate, "netmask not known, so 'ip broadcast' not supported");
		b0 = gen_linktype(cstate, ETHERTYPE_IP);
		hostmask = ~cstate->netmask;
		b1 = gen_mcmp(cstate, OR_LINKPL, 16, BPF_W, (bpf_int32)0, hostmask);
		b2 = gen_mcmp(cstate, OR_LINKPL, 16, BPF_W,
			      (bpf_int32)(~0 & hostmask), hostmask);
		gen_or(b1, b2);
		gen_and(b0, b2);
		return b2;
	}
	bpf_error(cstate, "only link-layer/IP broadcast filters supported");
	/* NOTREACHED */
	return NULL;
}